

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseContact_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"phone_number",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->phoneNumber);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"first_name",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->firstName);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"last_name",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->lastName);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"user_id",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->userId);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"vcard",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->vcard);
    std::__cxx11::string::~string((string *)&local_38);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseContact(const Contact::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "phone_number", object->phoneNumber);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    appendToJson(result, "user_id", object->userId);
    appendToJson(result, "vcard", object->vcard);
    removeLastComma(result);
    result += '}';
    return result;
}